

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O2

void __thiscall textureT::textureT(textureT *this)

{
  (this->Hash)._M_dataplus._M_p = (pointer)&(this->Hash).field_2;
  (this->Hash)._M_string_length = 0;
  (this->Hash).field_2._M_local_buf[0] = '\0';
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  (this->filename)._M_string_length = 0;
  (this->filename).field_2._M_local_buf[0] = '\0';
  nite::Color::Color(&this->transparency);
  (this->owners).super__Vector_base<nite::Texture_*,_std::allocator<nite::Texture_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->owners).super__Vector_base<nite::Texture_*,_std::allocator<nite::Texture_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->owners).super__Vector_base<nite::Texture_*,_std::allocator<nite::Texture_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::assign((char *)&this->Hash);
  std::__cxx11::string::assign((char *)&this->filename);
  this->texture = 0;
  this->empty = true;
  this->stick = false;
  return;
}

Assistant:

textureT(){
    	Hash = "NULL";
    	filename = "NULL";
		texture = 0;
		empty = 1;
		stick = false;
	}